

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QAbstractButtonListModel.cpp
# Opt level: O3

bool __thiscall
QAbstractButtonListModel::removeRows
          (QAbstractButtonListModel *this,int row,int count,QModelIndex *parent)

{
  Buttons *this_00;
  QAbstractButtonListModelPrivate *pQVar1;
  Data *pDVar2;
  undefined1 uVar3;
  int iVar4;
  undefined4 uVar5;
  QAbstractButtonListModel *pQVar6;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  if (((-1 < row && 0 < count) &&
      (iVar4 = (**(code **)(*(long *)this + 0x78))(this,parent), count + row <= iVar4)) &&
     ((parent->r < 0 || ((parent->c < 0 || (parent->m == (QAbstractItemModel *)0x0)))))) {
    local_48 = 0xffffffffffffffff;
    local_40 = 0;
    uStack_38 = 0;
    pQVar6 = this;
    QAbstractItemModel::beginRemoveRows((QModelIndex *)this,(int)&local_48,row);
    pQVar1 = this->d;
    if ((ulong)(uint)count + (ulong)(uint)row <= (ulong)(pQVar1->buttons).d.size) {
      this_00 = &pQVar1->buttons;
      pDVar2 = (this_00->d).d;
      if ((pDVar2 == (Data *)0x0) ||
         (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QArrayDataPointer<QMap<int,_QVariant>_>::reallocateAndGrow
                  (&this_00->d,GrowsAtEnd,0,(QArrayDataPointer<QMap<int,_QVariant>_> *)0x0);
      }
      QtPrivate::QMovableArrayOps<QMap<int,_QVariant>_>::erase
                ((QMovableArrayOps<QMap<int,_QVariant>_> *)this_00,
                 (pQVar1->buttons).d.ptr + (uint)row,(ulong)(uint)count);
      QAbstractItemModel::endRemoveRows();
      return true;
    }
    removeRows();
    uVar5 = (**(code **)(*(long *)pQVar6 + 0x78))();
    uVar3 = (**(code **)(*(long *)pQVar6 + 0x108))(pQVar6,0,uVar5);
    return (bool)uVar3;
  }
  return false;
}

Assistant:

bool QAbstractButtonListModel::removeRows(int row, int count, const QModelIndex &parent) {
    if (count < 1 || row < 0 || (row + count) > rowCount(parent) || parent.isValid()) {
        return false;
    }

    beginRemoveRows(QModelIndex(), row, row + count - 1);
    d->buttons.remove(row, count);
    endRemoveRows();

    return true;
}